

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Group.h
# Opt level: O0

void __thiscall FIX::Group::Group(Group *this,int field,int delim)

{
  message_order local_38;
  int local_18;
  int local_14;
  int delim_local;
  int field_local;
  Group *this_local;
  
  local_18 = delim;
  local_14 = field;
  _delim_local = this;
  FIX::message_order::message_order(&local_38,delim,0);
  FIX::FieldMap::FieldMap(&this->super_FieldMap,&local_38);
  message_order::~message_order(&local_38);
  *(undefined ***)this = &PTR__Group_00504bb8;
  this->m_field = local_14;
  this->m_delim = local_18;
  return;
}

Assistant:

Group(int field, int delim)
      : FieldMap(message_order(delim, 0)),
        m_field(field),
        m_delim(delim) {}